

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_RangeRowFixedVarOptimalSolution_Test::
SimplexTest_RangeRowFixedVarOptimalSolution_Test
          (SimplexTest_RangeRowFixedVarOptimalSolution_Test *this)

{
  undefined8 *in_RDI;
  SimplexTest *unaff_retaddr;
  
  SimplexTest::SimplexTest(unaff_retaddr);
  *in_RDI = &PTR__SimplexTest_RangeRowFixedVarOptimalSolution_Test_0026c7f0;
  return;
}

Assistant:

TEST_F(SimplexTest, RangeRowFixedVarOptimalSolution) {
  lp.add_column(ColType::Fixed, 0, 0, -1);
  lp.add_row(RowType::Range, -5, 5, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(0.0, z);
  EXPECT_DOUBLE_EQ(0.0, x[0]);
}